

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O3

void __thiscall cfd::api::json::PsbtMapData::PsbtMapData(PsbtMapData *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::api::json::PsbtMapData>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PsbtMapData_0072fad8;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->key_)._M_dataplus._M_p = (pointer)&(this->key_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->key_,"");
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->value_,"");
  CollectFieldName();
  return;
}

Assistant:

PsbtMapData() {
    CollectFieldName();
  }